

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

bool __thiscall Kernel::Clause::computable(Clause *this)

{
  bool bVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  ulong uVar4;
  
  for (uVar3 = 0; uVar4 = (ulong)((uint)*(undefined8 *)&this->field_0x38 & 0xfffff), uVar3 < uVar4;
      uVar3 = uVar3 + 1) {
    bVar1 = Literal::isAnswerLiteral(this->_literals[uVar3]);
    if (!bVar1) {
      iVar2 = (**(this->_literals[uVar3]->super_Term)._vptr_Term)();
      if ((char)iVar2 == '\0') break;
    }
  }
  return uVar4 <= uVar3;
}

Assistant:

bool Clause::computable() {
  for (unsigned i = 0; i < length(); ++i) {
    if ((*this)[i]->isAnswerLiteral()) {
      continue;
    }
    if (!(*this)[i]->computable()) {
      return false;
    }
  }
  return true;
}